

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall EntryUnpacker::operator()(EntryUnpacker *this,EntryKey *entryKey)

{
  bool bVar1;
  value_type vVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  ostream *poVar6;
  uchar *puVar7;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  EntryKey *in_RSI;
  BTree<NodeBTree,_NodeKey> *in_RDI;
  bool unpacked;
  uint nodeIndex;
  NodeKey nodeKey;
  NodeBTree nodeBtree;
  EntryUnpacker childUnpacker;
  EntryBTree childEntryBtree;
  path fullEntryPath;
  string entryPath;
  undefined4 in_stack_fffffffffffffd88;
  uint32_t in_stack_fffffffffffffd8c;
  VolumeFile *in_stack_fffffffffffffd90;
  VolumeFile *in_stack_fffffffffffffd98;
  EntryUnpacker *in_stack_fffffffffffffda0;
  EntryUnpacker *in_stack_fffffffffffffdc8;
  BTree<EntryBTree,_EntryKey> *in_stack_fffffffffffffdd0;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe58;
  EntryKey *in_stack_fffffffffffffe60;
  VolumeFile *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe88;
  NodeKey *in_stack_fffffffffffffe90;
  VolumeFile *in_stack_fffffffffffffe98;
  bool local_10d;
  path local_68;
  undefined4 local_48;
  string local_38 [32];
  EntryKey *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  VolumeFile::getEntryPath
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Cannot determine entry path.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    local_48 = 1;
    goto LAB_0013ea0c;
  }
  boost::filesystem::path::path
            ((path *)in_stack_fffffffffffffd90,
             (string_type *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  boost::filesystem::path::path
            ((path *)in_stack_fffffffffffffd90,
             (string_type *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  boost::filesystem::operator/((path *)in_stack_fffffffffffffd98,(path *)in_stack_fffffffffffffd90);
  boost::filesystem::path::~path((path *)0x13e602);
  boost::filesystem::path::~path((path *)0x13e60f);
  bVar1 = EntryKey::isDirectory(local_18);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"DIR:");
    poVar6 = std::operator<<(poVar6,local_38);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    boost::filesystem::create_directories((path *)0x13e678);
    VolumeFile::data((VolumeFile *)in_RDI->m_data);
    puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13e69b);
    EntryKey::linkIndex(local_18);
    vVar2 = VolumeFile::entryTreeOffset(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
    advancePointer<unsigned_char>(puVar7,(ulong)vVar2);
    EntryBTree::EntryBTree
              ((EntryBTree *)in_stack_fffffffffffffd90,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    EntryUnpacker(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                  (string *)in_stack_fffffffffffffd90,
                  (string *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    BTree<EntryBTree,EntryKey>::traverse<EntryUnpacker_const>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    ~EntryUnpacker((EntryUnpacker *)0x13e736);
LAB_0013e9db:
    local_1 = 1;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"FILE:");
    poVar6 = std::operator<<(poVar6,local_38);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    VolumeFile::data((VolumeFile *)in_RDI->m_data);
    puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13e82a);
    uVar3 = VolumeFile::nodeTreeOffset((VolumeFile *)in_RDI->m_data);
    advancePointer<unsigned_char>(puVar7,(ulong)uVar3);
    VolumeFile::hasMultipleVolumes((VolumeFile *)0x13e868);
    NodeBTree::NodeBTree
              ((NodeBTree *)in_stack_fffffffffffffda0,(uint8_t *)in_stack_fffffffffffffd98,
               SUB81((ulong)in_stack_fffffffffffffd90 >> 0x38,0));
    EntryKey::linkIndex(local_18);
    NodeKey::NodeKey((NodeKey *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
    uVar4 = BTree<NodeBTree,_NodeKey>::searchByKey(in_RDI,(NodeKey *)in_stack_fffffffffffffe00);
    local_10d = false;
    if (uVar4 != 0xffffffff) {
      boost::filesystem::path::string_abi_cxx11_(&local_68);
      local_10d = VolumeFile::unpackNode
                            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe88);
    }
    if (local_10d != false) goto LAB_0013e9db;
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
    boost::filesystem::path::string_abi_cxx11_(&local_68);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    this_00 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
              boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format(this_00)
    ;
    local_1 = 0;
  }
  local_48 = 1;
  boost::filesystem::path::~path((path *)0x13e9fb);
LAB_0013ea0c:
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool operator ()(const EntryKey& entryKey) const
	{
		const auto entryPath = m_volume.getEntryPath(entryKey, m_parentDirectory);
		if (entryPath.empty()) {
			std::cerr << "Cannot determine entry path." << std::endl;
			return false;
		}
		
		const auto fullEntryPath = boost::filesystem::path(m_outDirectory) / entryPath;
		
		if (entryKey.isDirectory()) {
			std::cout << "DIR:" << entryPath << std::endl;
			//entryKey.dump();
			
			boost::filesystem::create_directories(fullEntryPath);
			
			const EntryBTree childEntryBtree(
				advancePointer(m_volume.data().data(), m_volume.entryTreeOffset(entryKey.linkIndex()))
			);
			const EntryUnpacker childUnpacker(m_volume, m_outDirectory, entryPath);
			childEntryBtree.traverse(childUnpacker);
		} else {
			std::cout << "FILE:" << entryPath << std::endl;
			//entryKey.dump();
			
			const NodeBTree nodeBtree(
				advancePointer(m_volume.data().data(), m_volume.nodeTreeOffset()),
				m_volume.hasMultipleVolumes()
			);
			NodeKey nodeKey(entryKey.linkIndex());
			const auto nodeIndex = nodeBtree.searchByKey(nodeKey);
			bool unpacked = false;
			if (nodeIndex != NodeBTree::INVALID_INDEX) {
				if (m_volume.unpackNode(nodeKey, fullEntryPath.string())) {
					unpacked = true;
				}
			}
			if (!unpacked) {
				std::cerr << boost::format("Cannot unpack node: %s") % fullEntryPath.string() << std::endl;
				return false;
			}
		}

		return true;
	}